

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabel::focusOutEvent(QLabel *this,QFocusEvent *ev)

{
  QLabelPrivate *this_00;
  ulong uVar1;
  QFocusEvent *in_RDI;
  long in_FS_OFFSET;
  FocusReason reason;
  QLabelPrivate *d;
  QTextCursor cursor;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  QFocusEvent *e;
  undefined1 selectionClipboard;
  QLabelPrivate *in_stack_fffffffffffffff0;
  QTextCursor *cursor_00;
  QWidgetTextControl *this_01;
  
  this_01 = *(QWidgetTextControl **)(in_FS_OFFSET + 0x28);
  e = in_RDI;
  this_00 = d_func((QLabel *)0x5b0c8e);
  if (this_00->control != (QWidgetTextControl *)0x0) {
    QLabelPrivate::sendControlEvent(in_stack_fffffffffffffff0,(QEvent *)e);
    selectionClipboard = (undefined1)((ulong)e >> 0x38);
    cursor_00 = (QTextCursor *)&DAT_aaaaaaaaaaaaaaaa;
    QWidgetTextControl::textCursor((QWidgetTextControl *)this_00);
    in_stack_ffffffffffffffd4 = QFocusEvent::reason();
    if (((in_stack_ffffffffffffffd4 != 3) && (in_stack_ffffffffffffffd4 != 4)) &&
       (uVar1 = QTextCursor::hasSelection(), (uVar1 & 1) != 0)) {
      QTextCursor::clearSelection();
      QWidgetTextControl::setTextCursor(this_01,cursor_00,(bool)selectionClipboard);
    }
    QTextCursor::~QTextCursor((QTextCursor *)&stack0xfffffffffffffff0);
  }
  QWidget::focusOutEvent
            ((QWidget *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
  if (*(QWidgetTextControl **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabel::focusOutEvent(QFocusEvent *ev)
{
    Q_D(QLabel);
    if (d->control) {
        d->sendControlEvent(ev);
        QTextCursor cursor = d->control->textCursor();
        Qt::FocusReason reason = ev->reason();
        if (reason != Qt::ActiveWindowFocusReason
            && reason != Qt::PopupFocusReason
            && cursor.hasSelection()) {
            cursor.clearSelection();
            d->control->setTextCursor(cursor);
        }
    }

    QFrame::focusOutEvent(ev);
}